

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O2

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  undefined8 in_RAX;
  ushort uVar1;
  undefined8 uStack_18;
  
  if (n < 1000) {
    uVar1 = (ushort)n % 100;
    uStack_18._0_7_ = (undefined7)in_RAX;
    uStack_18 = CONCAT17((char)((ushort)n / 100),(undefined7)uStack_18) | 0x3000000000000000;
    ::fmt::v7::detail::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&uStack_18 + 7));
    uStack_18 = CONCAT17(uStack_18._7_1_,CONCAT16((char)(uVar1 / 10),(undefined6)uStack_18)) |
                0x30000000000000;
    ::fmt::v7::detail::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&uStack_18 + 6));
    uStack_18 = CONCAT26(uStack_18._6_2_,CONCAT15((char)(uVar1 % 10),(undefined5)uStack_18)) |
                0x300000000000;
    ::fmt::v7::detail::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&uStack_18 + 5));
    return;
  }
  append_int<unsigned_int>(n,dest);
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000)
    {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    }
    else
    {
        append_int(n, dest);
    }
}